

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

ProcessDescriptor * __thiscall
perfetto::protos::gen::ProcessDescriptor::operator=
          (ProcessDescriptor *this,ProcessDescriptor *param_1)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int64_t iVar3;
  int32_t iVar4;
  
  this->pid_ = param_1->pid_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->cmdline_,&param_1->cmdline_);
  ::std::__cxx11::string::operator=
            ((string *)&this->process_name_,(string *)&param_1->process_name_);
  uVar1 = *(undefined4 *)&param_1->field_0x4c;
  iVar3 = param_1->start_timestamp_ns_;
  uVar2 = *(undefined4 *)((long)&param_1->start_timestamp_ns_ + 4);
  this->process_priority_ = param_1->process_priority_;
  *(undefined4 *)&this->field_0x4c = uVar1;
  *(int *)&this->start_timestamp_ns_ = (int)iVar3;
  *(undefined4 *)((long)&this->start_timestamp_ns_ + 4) = uVar2;
  iVar4 = param_1->legacy_sort_index_;
  this->chrome_process_type_ = param_1->chrome_process_type_;
  this->legacy_sort_index_ = iVar4;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->process_labels_,&param_1->process_labels_);
  ::std::__cxx11::string::operator=
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

bool ProcessDescriptor::operator==(const ProcessDescriptor& other) const {
  return unknown_fields_ == other.unknown_fields_
   && pid_ == other.pid_
   && cmdline_ == other.cmdline_
   && process_name_ == other.process_name_
   && process_priority_ == other.process_priority_
   && start_timestamp_ns_ == other.start_timestamp_ns_
   && chrome_process_type_ == other.chrome_process_type_
   && legacy_sort_index_ == other.legacy_sort_index_
   && process_labels_ == other.process_labels_;
}